

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O0

SubControl __thiscall
QStyleSheetStyle::hitTestComplexControl
          (QStyleSheetStyle *this,ComplexControl cc,QStyleOptionComplex *opt,QPoint *pt,QWidget *w)

{
  long lVar1;
  bool bVar2;
  QStyle *pQVar3;
  QRenderRule *this_00;
  QStyleOptionTitleBar *pQVar4;
  QRect *pQVar5;
  ulong uVar6;
  undefined8 in_RCX;
  QStyleOption *in_RDX;
  uint in_ESI;
  QStyleSheetStyle *in_RDI;
  undefined8 in_R8;
  long in_FS_OFFSET;
  uint ctrl;
  SubControl sc;
  QStyleOptionTitleBar *tb;
  QRect r;
  QHash<QStyle::SubControl,_QRect> layout;
  QStyleSheetStyleRecursionGuard recursion_guard;
  QRenderRule rule_1;
  QRenderRule rule;
  undefined4 in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe84;
  int iVar7;
  SubControl local_178;
  SubControl local_174;
  undefined4 in_stack_fffffffffffffeb0;
  SubControl local_140;
  undefined1 *local_138;
  undefined1 *local_130;
  undefined1 *local_128;
  QStyleSheetStyleRecursionGuard local_119;
  QWidget *in_stack_fffffffffffffee8;
  QPoint *in_stack_fffffffffffffef0;
  QStyleOptionComplex *in_stack_fffffffffffffef8;
  ComplexControl in_stack_ffffffffffffff04;
  QCommonStyle *in_stack_ffffffffffffff08;
  QStyleOptionTitleBar *in_stack_ffffffffffffff10;
  QWidget *in_stack_ffffffffffffff18;
  QStyleSheetStyle *in_stack_ffffffffffffff20;
  int in_stack_ffffffffffffff34;
  QObject *in_stack_ffffffffffffff38;
  undefined1 local_90 [44];
  int in_stack_ffffffffffffff9c;
  QStyleOption *in_stack_ffffffffffffffa0;
  QObject *in_stack_ffffffffffffffa8;
  QStyleSheetStyle *in_stack_ffffffffffffffb0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((globalStyleSheetStyle != (QStyleSheetStyle *)0x0) && (globalStyleSheetStyle != in_RDI)) {
    pQVar3 = baseStyle(in_RDI);
    local_140 = (**(code **)(*(long *)pQVar3 + 0xd0))(pQVar3,in_ESI,in_RDX,in_RCX,in_R8);
    goto LAB_0043a2eb;
  }
  local_119.guarded = true;
  QStyleSheetStyleRecursionGuard::QStyleSheetStyleRecursionGuard(&local_119,in_RDI);
  this_00 = (QRenderRule *)(ulong)in_ESI;
  switch(this_00) {
  case (QRenderRule *)0x2:
    memset(&stack0xfffffffffffffee8,0xaa,0x88);
    renderRule(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
               in_stack_ffffffffffffff9c);
    bVar2 = QRenderRule::hasDrawable(this_00);
    if ((bVar2) || (bVar2 = QRenderRule::hasBox(this_00), bVar2)) {
      iVar7 = 0;
    }
    else {
      iVar7 = 2;
    }
    QRenderRule::~QRenderRule(this_00);
    if (iVar7 != 0) goto LAB_0043a2ac;
  case (QRenderRule *)0x0:
  case (QRenderRule *)0x1:
  case (QRenderRule *)0x3:
  case (QRenderRule *)0x4:
  case (QRenderRule *)0x7:
    local_140 = QCommonStyle::hitTestComplexControl
                          (in_stack_ffffffffffffff08,in_stack_ffffffffffffff04,
                           in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
                           in_stack_fffffffffffffee8);
    break;
  case (QRenderRule *)0x5:
    pQVar4 = qstyleoption_cast<QStyleOptionTitleBar_const*>(in_RDX);
    if (pQVar4 != (QStyleOptionTitleBar *)0x0) {
      memset(local_90,0xaa,0x88);
      renderRule(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                 in_stack_ffffffffffffff9c);
      bVar2 = QRenderRule::hasDrawable(this_00);
      if (((bVar2) || (bVar2 = QRenderRule::hasBox(this_00), bVar2)) ||
         (bVar2 = QRenderRule::hasBorder(this_00), bVar2)) {
        local_128 = &DAT_aaaaaaaaaaaaaaaa;
        titleBarLayout(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10
                      );
        local_138 = &DAT_aaaaaaaaaaaaaaaa;
        local_130 = &DAT_aaaaaaaaaaaaaaaa;
        QRect::QRect((QRect *)this_00);
        local_174 = SC_None;
        for (local_178 = SC_ComboBoxFrame; local_178 < (SC_TitleBarLabel|SC_ComboBoxFrame);
            local_178 = local_178 << 1) {
          pQVar5 = QHash<QStyle::SubControl,_QRect>::operator[]
                             ((QHash<QStyle::SubControl,_QRect> *)
                              CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                              (SubControl *)in_RDI);
          local_138 = *(undefined1 **)pQVar5;
          local_130 = *(undefined1 **)&pQVar5->x2;
          bVar2 = QRect::isValid((QRect *)this_00);
          if ((bVar2) &&
             (uVar6 = QRect::contains((QPoint *)&local_138,SUB81(in_RCX,0)), (uVar6 & 1) != 0)) {
            local_174 = local_178;
            break;
          }
        }
        local_140 = local_174;
        iVar7 = 1;
        QHash<QStyle::SubControl,_QRect>::~QHash((QHash<QStyle::SubControl,_QRect> *)this_00);
      }
      else {
        iVar7 = 0;
      }
      QRenderRule::~QRenderRule(this_00);
      if (iVar7 != 0) break;
    }
    goto LAB_0043a2ac;
  default:
LAB_0043a2ac:
    pQVar3 = baseStyle(in_RDI);
    local_140 = (**(code **)(*(long *)pQVar3 + 0xd0))(pQVar3,in_ESI,in_RDX,in_RCX,in_R8);
    break;
  case (QRenderRule *)0x8:
    bVar2 = hasStyleRule((QStyleSheetStyle *)CONCAT44(in_ESI,in_stack_fffffffffffffeb0),
                         in_stack_ffffffffffffff38,in_stack_ffffffffffffff34);
    if (((!bVar2) &&
        (bVar2 = hasStyleRule((QStyleSheetStyle *)CONCAT44(in_ESI,in_stack_fffffffffffffeb0),
                              in_stack_ffffffffffffff38,in_stack_ffffffffffffff34), !bVar2)) &&
       (bVar2 = hasStyleRule((QStyleSheetStyle *)CONCAT44(in_ESI,in_stack_fffffffffffffeb0),
                             in_stack_ffffffffffffff38,in_stack_ffffffffffffff34), !bVar2))
    goto LAB_0043a2ac;
    local_140 = QCommonStyle::hitTestComplexControl
                          (in_stack_ffffffffffffff08,in_stack_ffffffffffffff04,
                           in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
                           in_stack_fffffffffffffee8);
  }
  QStyleSheetStyleRecursionGuard::~QStyleSheetStyleRecursionGuard(&local_119);
LAB_0043a2eb:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_140;
  }
  __stack_chk_fail();
}

Assistant:

QStyle::SubControl QStyleSheetStyle::hitTestComplexControl(ComplexControl cc, const QStyleOptionComplex *opt,
                                 const QPoint &pt, const QWidget *w) const
{
    RECURSION_GUARD(return baseStyle()->hitTestComplexControl(cc, opt, pt, w))
    switch (cc) {
    case CC_TitleBar:
        if (const QStyleOptionTitleBar *tb = qstyleoption_cast<const QStyleOptionTitleBar *>(opt)) {
            QRenderRule rule = renderRule(w, opt, PseudoElement_TitleBar);
            if (rule.hasDrawable() || rule.hasBox() || rule.hasBorder()) {
                QHash<QStyle::SubControl, QRect> layout = titleBarLayout(w, tb);
                QRect r;
                QStyle::SubControl sc = QStyle::SC_None;
                uint ctrl = SC_TitleBarSysMenu;
                while (ctrl <= SC_TitleBarLabel) {
                    r = layout[QStyle::SubControl(ctrl)];
                    if (r.isValid() && r.contains(pt)) {
                        sc = QStyle::SubControl(ctrl);
                        break;
                    }
                    ctrl <<= 1;
                }
                return sc;
            }
        }
        break;

    case CC_MdiControls:
        if (hasStyleRule(w, PseudoElement_MdiCloseButton)
            || hasStyleRule(w, PseudoElement_MdiNormalButton)
            || hasStyleRule(w, PseudoElement_MdiMinButton))
            return QWindowsStyle::hitTestComplexControl(cc, opt, pt, w);
        break;

    case CC_ScrollBar: {
        QRenderRule rule = renderRule(w, opt);
        if (!rule.hasDrawable() && !rule.hasBox())
            break;
                       }
        Q_FALLTHROUGH();
    case CC_SpinBox:
    case CC_GroupBox:
    case CC_ComboBox:
    case CC_Slider:
    case CC_ToolButton:
        return QWindowsStyle::hitTestComplexControl(cc, opt, pt, w);
    default:
        break;
    }

    return baseStyle()->hitTestComplexControl(cc, opt, pt, w);
}